

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O0

void test_font_variety(wins *wins_ar,int ar_len,Am_Style *bs,bool invert)

{
  Am_Drawonable *font_win_00;
  int local_6c;
  int i_1;
  Am_Drawonable *font_win;
  int i;
  Am_Font local_50 [8];
  int local_48;
  int local_44;
  int under;
  int it;
  int size;
  int fam;
  int top;
  bool invert_local;
  Am_Style *bs_local;
  wins *pwStack_20;
  int ar_len_local;
  wins *wins_ar_local;
  
  size = 0;
  test_string = "Egypt";
  test_str_len = 5;
  fam._3_1_ = invert;
  _top = bs;
  bs_local._4_4_ = ar_len;
  pwStack_20 = wins_ar;
  for (it = 0; it < 3; it = it + 1) {
    for (under = 1; under < 4; under = under + 2) {
      for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
        for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
          Am_Font::Am_Font(local_50,test_font_variety::family_array[it],false,local_44 != 0,
                           local_48 != 0,test_font_variety::size_array[under]);
          Am_Font::operator=((Am_Font *)&test_font,local_50);
          Am_Font::~Am_Font(local_50);
          for (font_win._0_4_ = 0; (int)font_win < bs_local._4_4_;
              font_win._0_4_ = (int)font_win + 1) {
            font_win_00 = pwStack_20[(int)font_win].font_win;
            update_font_numbers(font_win_00,false);
            (**(code **)(*(long *)font_win_00 + 0x170))
                      (font_win_00,&Am_Black,test_string,test_str_len,&test_font,10,size,0,_top,
                       fam._3_1_ & 1);
            (**(code **)(*(long *)font_win_00 + 0x160))
                      (font_win_00,&black,&Am_No_Style,10,size,test_string_width,test_string_height,
                       0);
          }
          size = size + test_string_height + 4;
        }
      }
    }
  }
  for (local_6c = 0; local_6c < bs_local._4_4_; local_6c = local_6c + 1) {
    (**(code **)(*(long *)pwStack_20[local_6c].font_win + 0xa0))();
  }
  return;
}

Assistant:

void
test_font_variety(wins *wins_ar, int ar_len, Am_Style &bs, bool invert)
{
  // Since family_array and size_array are static, they persists across
  // multiple invocations of the enclosing function.  They will not be
  // reinitialized when the function is invoked a second time.
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[4] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_LARGE, Am_FONT_VERY_LARGE};
  int top = 0;
  test_string = "Egypt";
  test_str_len = 5;
  for (int fam = 0; fam < 3; fam++) {
    for (int size = 1; size < 4; size += 2) {
      for (int it = 0; it < 2; it++) {
        for (int under = 0; under < 2; under++) {
          test_font =
              Am_Font(family_array[fam], false, it, under, size_array[size]);

          for (int i = 0; i < ar_len; i++) {
            Am_Drawonable *font_win = wins_ar[i].font_win;
            update_font_numbers(font_win);

            font_win->Draw_Text(Am_Black, test_string, test_str_len, test_font,
                                10, top, Am_DRAW_COPY, bs, invert);
            font_win->Draw_Rectangle(black, Am_No_Style, 10, top,
                                     test_string_width, test_string_height);
          }
          top = top + test_string_height + 4;
        }
      }
    }
  }
  for (int i = 0; i < ar_len; i++) {
    (wins_ar[i].font_win)->Flush_Output();
  }
}